

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch_and_reduce_algorithm.cpp
# Opt level: O0

void __thiscall
branch_and_reduce_algorithm::compute_fold
          (branch_and_reduce_algorithm *this,vector<int,_std::allocator<int>_> *S,
          vector<int,_std::allocator<int>_> *NS)

{
  allocator<std::vector<int,_std::allocator<int>_>_> *this_00;
  value_type vVar1;
  int iVar2;
  int iVar3;
  pointer piVar4;
  bool bVar5;
  bool bVar6;
  size_type sVar7;
  size_type sVar8;
  const_reference pvVar9;
  reference pvVar10;
  vector<int,_std::allocator<int>_> *this_01;
  reference pvVar11;
  iterator __first;
  reference piVar12;
  reference piVar13;
  reference this_02;
  iterator iStack_2e0;
  int vv_1;
  iterator __end3_1;
  iterator __begin3_1;
  value_type *__range3_1;
  iterator iStack_2c0;
  int v_6;
  iterator __end2_3;
  iterator __begin2_3;
  vector<int,_std::allocator<int>_> *__range2_3;
  iterator iStack_2a0;
  int vv;
  iterator __end3;
  iterator __begin3;
  value_type *__range3;
  iterator iStack_280;
  int v_5;
  iterator __end2_2;
  iterator __begin2_2;
  vector<int,_std::allocator<int>_> *__range2_2;
  undefined1 local_200 [24];
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_1e8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_1e0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_1d8;
  undefined1 local_1d0 [8];
  vector<int,_std::allocator<int>_> copyOfTmp_1;
  iterator iStack_1b0;
  int u_1;
  iterator __end2_1;
  iterator __begin2_1;
  value_type *__range2_1;
  uint uStack_190;
  bool add;
  int v_4;
  uint i_2;
  int v_3;
  const_iterator __end1_3;
  const_iterator __begin1_3;
  vector<int,_std::allocator<int>_> *__range1_3;
  const_iterator cStack_168;
  int v_2;
  const_iterator __end1_2;
  const_iterator __begin1_2;
  vector<int,_std::allocator<int>_> *__range1_2;
  undefined1 local_148 [8];
  vector<int,_std::allocator<int>_> vs;
  allocator<int> local_119;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_118;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_110;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_108;
  undefined1 local_100 [8];
  vector<int,_std::allocator<int>_> copyOfTmp;
  undefined1 local_e0 [8];
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  newAdj;
  iterator iStack_c0;
  int u;
  iterator __end2;
  iterator __begin2;
  value_type *__range2;
  const_iterator cStack_a0;
  int v_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<int,_std::allocator<int>_> *__range1_1;
  int p;
  vector<int,_std::allocator<int>_> *tmp;
  const_iterator cStack_70;
  int v;
  const_iterator __end1;
  const_iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  int s;
  uint i_1;
  uint i;
  allocator<int> local_39;
  undefined1 local_38 [8];
  vector<int,_std::allocator<int>_> removed;
  vector<int,_std::allocator<int>_> *NS_local;
  vector<int,_std::allocator<int>_> *S_local;
  branch_and_reduce_algorithm *this_local;
  
  removed.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)NS;
  sVar7 = std::vector<int,_std::allocator<int>_>::size(NS);
  sVar8 = std::vector<int,_std::allocator<int>_>::size(S);
  if (sVar7 != sVar8 + 1) {
    __assert_fail("NS.size() == S.size() + 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Hespian[P]CutBranching/algo/branch_and_reduce_algorithm.cpp"
                  ,0xca,
                  "void branch_and_reduce_algorithm::compute_fold(const std::vector<int> &, const std::vector<int> &)"
                 );
  }
  sVar7 = std::vector<int,_std::allocator<int>_>::size(S);
  std::allocator<int>::allocator(&local_39);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_38,sVar7 * 2,&local_39);
  std::allocator<int>::~allocator(&local_39);
  for (s = 0; sVar7 = std::vector<int,_std::allocator<int>_>::size(S), (uint)s < sVar7; s = s + 1) {
    pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](S,(ulong)(uint)s);
    vVar1 = *pvVar9;
    pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)local_38,(ulong)(uint)s);
    *pvVar10 = vVar1;
  }
  for (__range1._4_4_ = 0; sVar7 = std::vector<int,_std::allocator<int>_>::size(S),
      __range1._4_4_ < sVar7; __range1._4_4_ = __range1._4_4_ + 1) {
    pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)
                        removed.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,(ulong)(__range1._4_4_ + 1));
    vVar1 = *pvVar9;
    sVar7 = std::vector<int,_std::allocator<int>_>::size(S);
    pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)local_38,sVar7 + __range1._4_4_);
    *pvVar10 = vVar1;
  }
  pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)
                      removed.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,0);
  iVar2 = *pvVar9;
  fast_set::clear(&this->used);
  __end1 = std::vector<int,_std::allocator<int>_>::begin(S);
  cStack_70 = std::vector<int,_std::allocator<int>_>::end(S);
  while (bVar5 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffff90),
        piVar4 = removed.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage, bVar5) {
    piVar12 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
              operator*(&__end1);
    fast_set::add(&this->used,*piVar12);
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1);
  }
  this_01 = &this->modTmp;
  __range1_1._4_4_ = 0;
  __end1_1 = std::vector<int,_std::allocator<int>_>::begin
                       ((vector<int,_std::allocator<int>_> *)
                        removed.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
  cStack_a0 = std::vector<int,_std::allocator<int>_>::end
                        ((vector<int,_std::allocator<int>_> *)piVar4);
  while( true ) {
    bVar5 = __gnu_cxx::operator!=(&__end1_1,&stack0xffffffffffffff60);
    if (!bVar5) {
      this_00 = (allocator<std::vector<int,_std::allocator<int>_>_> *)
                ((long)&copyOfTmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage + 7);
      std::allocator<std::vector<int,_std::allocator<int>_>_>::allocator(this_00);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)local_e0,(long)(__range1_1._4_4_ + 1),this_00);
      std::allocator<std::vector<int,_std::allocator<int>_>_>::~allocator
                ((allocator<std::vector<int,_std::allocator<int>_>_> *)
                 ((long)&copyOfTmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 7));
      local_108._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(this_01);
      local_118._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(this_01);
      local_110 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                  operator+(&local_118,(long)__range1_1._4_4_);
      std::allocator<int>::allocator(&local_119);
      std::vector<int,std::allocator<int>>::
      vector<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
                ((vector<int,std::allocator<int>> *)local_100,local_108,local_110,&local_119);
      std::allocator<int>::~allocator(&local_119);
      pvVar11 = std::
                vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                              *)local_e0,0);
      std::vector<int,_std::allocator<int>_>::swap
                (pvVar11,(vector<int,_std::allocator<int>_> *)local_100);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)local_100);
      pvVar11 = std::
                vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                              *)local_e0,0);
      __first = std::vector<int,_std::allocator<int>_>::begin(pvVar11);
      pvVar11 = std::
                vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                              *)local_e0,0);
      vs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)std::vector<int,_std::allocator<int>_>::end(pvVar11);
      std::sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 __first._M_current,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 vs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_end_of_storage);
      std::allocator<int>::allocator((allocator<int> *)((long)&__range1_2 + 7));
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)local_148,(long)(__range1_1._4_4_ + 1),
                 (allocator<int> *)((long)&__range1_2 + 7));
      std::allocator<int>::~allocator((allocator<int> *)((long)&__range1_2 + 7));
      pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)local_148,0);
      *pvVar10 = iVar2;
      fast_set::clear(&this->used);
      __end1_2 = std::vector<int,_std::allocator<int>_>::begin(S);
      cStack_168 = std::vector<int,_std::allocator<int>_>::end(S);
      while (bVar5 = __gnu_cxx::operator!=(&__end1_2,&stack0xfffffffffffffe98),
            piVar4 = removed.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage, bVar5) {
        piVar12 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                  ::operator*(&__end1_2);
        fast_set::add(&this->used,*piVar12);
        __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
        operator++(&__end1_2);
      }
      __end1_3 = std::vector<int,_std::allocator<int>_>::begin
                           ((vector<int,_std::allocator<int>_> *)
                            removed.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
      _i_2 = std::vector<int,_std::allocator<int>_>::end
                       ((vector<int,_std::allocator<int>_> *)piVar4);
      while (bVar5 = __gnu_cxx::operator!=
                               (&__end1_3,
                                (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                 *)&i_2), bVar5) {
        piVar12 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                  ::operator*(&__end1_3);
        fast_set::add(&this->used,*piVar12);
        __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
        operator++(&__end1_3);
      }
      uStack_190 = 0;
      while( true ) {
        pvVar11 = std::
                  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                *)local_e0,0);
        sVar7 = std::vector<int,_std::allocator<int>_>::size(pvVar11);
        if (sVar7 <= uStack_190) break;
        pvVar11 = std::
                  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                *)local_e0,0);
        pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](pvVar11,(ulong)uStack_190);
        iVar3 = *pvVar10;
        __range1_1._4_4_ = 0;
        bVar5 = false;
        pvVar11 = std::
                  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ::operator[](&this->adj,(long)iVar3);
        __end2_1 = std::vector<int,_std::allocator<int>_>::begin(pvVar11);
        iStack_1b0 = std::vector<int,_std::allocator<int>_>::end(pvVar11);
        while (bVar6 = __gnu_cxx::operator!=(&__end2_1,&stack0xfffffffffffffe50), bVar6) {
          piVar13 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                    operator*(&__end2_1);
          copyOfTmp_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._4_4_ = *piVar13;
          pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&this->x,(long)copyOfTmp_1.
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_end_of_storage._4_4_);
          if ((*pvVar10 < 0) &&
             (bVar6 = fast_set::get(&this->used,
                                    copyOfTmp_1.super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_), !bVar6
             )) {
            if ((!bVar5) &&
               (iVar2 < copyOfTmp_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage._4_4_)) {
              pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                                  (this_01,(long)__range1_1._4_4_);
              *pvVar10 = iVar2;
              bVar5 = true;
              __range1_1._4_4_ = __range1_1._4_4_ + 1;
            }
            vVar1 = copyOfTmp_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage._4_4_;
            pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                                (this_01,(long)__range1_1._4_4_);
            *pvVar10 = vVar1;
            __range1_1._4_4_ = __range1_1._4_4_ + 1;
          }
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&__end2_1);
        }
        if (!bVar5) {
          pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                              (this_01,(long)__range1_1._4_4_);
          *pvVar10 = iVar2;
          __range1_1._4_4_ = __range1_1._4_4_ + 1;
        }
        pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)local_148,(ulong)(uStack_190 + 1))
        ;
        *pvVar10 = iVar3;
        local_1d8._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(this_01);
        local_1e8._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(this_01);
        local_1e0 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                    operator+(&local_1e8,(long)__range1_1._4_4_);
        std::allocator<int>::allocator((allocator<int> *)(local_200 + 0x17));
        std::vector<int,std::allocator<int>>::
        vector<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
                  ((vector<int,std::allocator<int>> *)local_1d0,local_1d8,local_1e0,
                   (allocator<int> *)(local_200 + 0x17));
        std::allocator<int>::~allocator((allocator<int> *)(local_200 + 0x17));
        pvVar11 = std::
                  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                *)local_e0,(ulong)(uStack_190 + 1));
        std::vector<int,_std::allocator<int>_>::swap
                  (pvVar11,(vector<int,_std::allocator<int>_> *)local_1d0);
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)local_1d0);
        uStack_190 = uStack_190 + 1;
      }
      sVar7 = std::vector<int,_std::allocator<int>_>::size(S);
      fold::fold((fold *)&__range2_2,(int)sVar7,(vector<int,_std::allocator<int>_> *)local_38,
                 (vector<int,_std::allocator<int>_> *)local_148,
                 (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  *)local_e0,this);
      std::make_shared<fold,fold>((fold *)local_200);
      iVar2 = this->modifiedN;
      this->modifiedN = iVar2 + 1;
      this_02 = std::vector<std::shared_ptr<modified>,_std::allocator<std::shared_ptr<modified>_>_>
                ::operator[](&this->modifieds,(long)iVar2);
      std::shared_ptr<modified>::operator=(this_02,(shared_ptr<fold> *)local_200);
      std::shared_ptr<fold>::~shared_ptr((shared_ptr<fold> *)local_200);
      fold::~fold((fold *)&__range2_2);
      if ((USE_DEPENDENCY_CHECKING & 1U) != 0) {
        __end2_2 = std::vector<int,_std::allocator<int>_>::begin
                             ((vector<int,_std::allocator<int>_> *)local_148);
        iStack_280 = std::vector<int,_std::allocator<int>_>::end
                               ((vector<int,_std::allocator<int>_> *)local_148);
        while (bVar5 = __gnu_cxx::operator!=(&__end2_2,&stack0xfffffffffffffd80), bVar5) {
          piVar13 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                    operator*(&__end2_2);
          iVar2 = *piVar13;
          ArraySet::Insert(&this->dc_candidates,iVar2);
          pvVar11 = std::
                    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ::operator[](&this->adj,(long)iVar2);
          __end3 = std::vector<int,_std::allocator<int>_>::begin(pvVar11);
          iStack_2a0 = std::vector<int,_std::allocator<int>_>::end(pvVar11);
          while (bVar5 = __gnu_cxx::operator!=(&__end3,&stack0xfffffffffffffd60), bVar5) {
            piVar13 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                      operator*(&__end3);
            ArraySet::Insert(&this->dc_candidates,*piVar13);
            __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                      (&__end3);
          }
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&__end2_2);
        }
        __end2_3 = std::vector<int,_std::allocator<int>_>::begin
                             ((vector<int,_std::allocator<int>_> *)local_38);
        iStack_2c0 = std::vector<int,_std::allocator<int>_>::end
                               ((vector<int,_std::allocator<int>_> *)local_38);
        while (bVar5 = __gnu_cxx::operator!=(&__end2_3,&stack0xfffffffffffffd40), bVar5) {
          piVar13 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                    operator*(&__end2_3);
          iVar2 = *piVar13;
          ArraySet::Insert(&this->dc_candidates,iVar2);
          pvVar11 = std::
                    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ::operator[](&this->adj,(long)iVar2);
          __end3_1 = std::vector<int,_std::allocator<int>_>::begin(pvVar11);
          iStack_2e0 = std::vector<int,_std::allocator<int>_>::end(pvVar11);
          while (bVar5 = __gnu_cxx::operator!=(&__end3_1,&stack0xfffffffffffffd20), bVar5) {
            piVar13 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                      operator*(&__end3_1);
            ArraySet::Insert(&this->dc_candidates,*piVar13);
            __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                      (&__end3_1);
          }
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&__end2_3);
        }
      }
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)local_148);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)local_e0);
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_38)
      ;
      return;
    }
    piVar12 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
              operator*(&__end1_1);
    iVar3 = *piVar12;
    bVar5 = fast_set::get(&this->used,iVar3);
    if (((bVar5 ^ 0xffU) & 1) == 0) break;
    pvVar11 = std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::operator[](&this->adj,(long)iVar3);
    __end2 = std::vector<int,_std::allocator<int>_>::begin(pvVar11);
    iStack_c0 = std::vector<int,_std::allocator<int>_>::end(pvVar11);
    while (bVar5 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffff40), bVar5) {
      piVar13 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                operator*(&__end2);
      newAdj.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = *piVar13;
      pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                          (&this->x,(long)newAdj.
                                          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      if ((*pvVar10 < 0) &&
         (bVar5 = fast_set::add(&this->used,
                                newAdj.
                                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_),
         vVar1 = newAdj.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_, bVar5)) {
        pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](this_01,(long)__range1_1._4_4_)
        ;
        *pvVar10 = vVar1;
        __range1_1._4_4_ = __range1_1._4_4_ + 1;
      }
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end2);
    }
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1_1);
  }
  __assert_fail("!used.get(v)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Hespian[P]CutBranching/algo/branch_and_reduce_algorithm.cpp"
                ,0xdc,
                "void branch_and_reduce_algorithm::compute_fold(const std::vector<int> &, const std::vector<int> &)"
               );
}

Assistant:

void branch_and_reduce_algorithm::compute_fold(std::vector<int> const &S, std::vector<int> const &NS) {
    assert(NS.size() == S.size() + 1);

    // remove all vertices but the 1. neighbour
    std::vector<int> removed(S.size() * 2);
    for (unsigned int i = 0; i < S.size(); i++)
        removed[i] = S[i];
    for (unsigned int i = 0; i < S.size(); i++)
        removed[S.size() + i] = NS[1 + i];

    // s = first neighbour
    int s = NS[0];
    used.clear();
    for (int v : S)
        used.add(v);
    std::vector<int> &tmp = modTmp;
    int p = 0;
    for (int v : NS)
    {
        assert(!used.get(v));
        for (int u : adj[v])
            if (x[u] < 0 && used.add(u))
            {
                tmp[p++] = u;
            }
    }
    // tmp contains N(N(S))\S

    // set edges of s
    std::vector<std::vector<int>> newAdj(p + 1);
    {
        std::vector<int> copyOfTmp(tmp.begin(), tmp.begin() + p);
        newAdj[0].swap(copyOfTmp);
    }
    std::sort(newAdj[0].begin(), newAdj[0].end());
    std::vector<int> vs(p + 1);
    vs[0] = s;
    used.clear();
    for (int v : S)
        used.add(v);
    for (int v : NS)
        used.add(v);

    // set edges of vertices in tmp
    for (unsigned int i = 0; i < newAdj[0].size(); i++)
    {
        int v = newAdj[0][i];
        p = 0;
        bool add = false;
        for (int u : adj[v])
            if (x[u] < 0 && !used.get(u))
            {
                if (!add && s < u)
                {
                    tmp[p++] = s;
                    add = true;
                }
                tmp[p++] = u;
            }
        if (!add)
            tmp[p++] = s;
        vs[1 + i] = v;

        {
            std::vector<int> copyOfTmp(tmp.begin(), tmp.begin() + p);
            newAdj[i + 1].swap(copyOfTmp);
        }
    }

    modifieds[modifiedN++] = make_shared<fold>(fold(S.size(), removed, vs, newAdj, this));

    // dependency checking
    if (USE_DEPENDENCY_CHECKING) {
        for (int v : vs) {
            dc_candidates.Insert(v);

            for (int vv : adj[v]) {
                dc_candidates.Insert(vv);
            }
        }

        for (int v : removed) {
            dc_candidates.Insert(v);

            for (int vv : adj[v]) {
                dc_candidates.Insert(vv);
            }
        }
    }
}